

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O1

int uv_read_stop(uv_stream_t *stream)

{
  uv_stream_t *stream_local;
  
  if ((stream->flags & 0x1000) != 0) {
    stream->flags = stream->flags & 0xffffefff;
    uv__io_stop(stream->loop,&stream->io_watcher,1);
    if (((stream->flags & 4) != 0) &&
       (stream->flags = stream->flags & 0xfffffffb, (stream->flags & 8) != 0)) {
      stream->loop->active_handles = stream->loop->active_handles - 1;
    }
    uv__stream_osx_interrupt_select(stream);
    stream->read_cb = (uv_read_cb)0x0;
    stream->alloc_cb = (uv_alloc_cb)0x0;
  }
  return 0;
}

Assistant:

int uv_read_stop(uv_stream_t* stream) {
  if (!(stream->flags & UV_HANDLE_READING))
    return 0;

  stream->flags &= ~UV_HANDLE_READING;
  uv__io_stop(stream->loop, &stream->io_watcher, POLLIN);
  uv__handle_stop(stream);
  uv__stream_osx_interrupt_select(stream);

  stream->read_cb = NULL;
  stream->alloc_cb = NULL;
  return 0;
}